

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hkdf_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2cd037::HKDFTest_TestVectors_Test::TestBody(HKDFTest_TestVectors_Test *this)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  undefined **ppuVar4;
  EVP_MD *pEVar5;
  char *pcVar6;
  pointer peVar7;
  const_iterator pbVar8;
  long lVar9;
  uint8_t *puVar10;
  AssertHelper local_ce0;
  Message local_cd8;
  Bytes local_cd0;
  Bytes local_cc0;
  undefined1 local_cb0 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_c80;
  Message local_c78;
  int local_c6c;
  undefined1 local_c68 [8];
  AssertionResult gtest_ar__32;
  size_t len_1;
  AssertHelper local_c30;
  Message local_c28;
  undefined1 local_c20 [8];
  AssertionResult gtest_ar__31;
  EVP_PKEY_CTX *use_ctx_2;
  UniquePtr<EVP_PKEY_CTX> copy_2;
  ScopedTrace gtest_trace_364;
  bool copy_ctx_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  initializer_list<bool> local_be0;
  initializer_list<bool> *local_bd0;
  initializer_list<bool> *__range2_2;
  AssertHelper local_ba8;
  Message local_ba0;
  int local_b94;
  undefined1 local_b90 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_b60;
  Message local_b58;
  int local_b4c;
  undefined1 local_b48 [8];
  AssertionResult gtest_ar__29;
  AssertHelper local_b18;
  Message local_b10;
  int local_b04;
  undefined1 local_b00 [8];
  AssertionResult gtest_ar__28;
  AssertHelper local_ad0;
  Message local_ac8;
  int local_abc;
  undefined1 local_ab8 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_a88;
  Message local_a80;
  int local_a74;
  undefined1 local_a70 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_a40;
  Message local_a38;
  int local_a2c;
  undefined1 local_a28 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_9f8;
  Message local_9f0;
  int local_9e4;
  undefined1 local_9e0 [8];
  AssertionResult gtest_ar__24;
  AssertHelper local_9b0;
  Message local_9a8;
  undefined1 local_9a0 [8];
  AssertionResult gtest_ar__23;
  Message local_988;
  Bytes local_980;
  Bytes local_970;
  undefined1 local_960 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_930;
  Message local_928;
  int local_91c;
  undefined1 local_918 [8];
  AssertionResult gtest_ar__22;
  size_t len;
  AssertHelper local_8e0;
  Message local_8d8;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar__21;
  EVP_PKEY_CTX *use_ctx_1;
  UniquePtr<EVP_PKEY_CTX> copy_1;
  ScopedTrace gtest_trace_335;
  bool copy_ctx_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  initializer_list<bool> local_890;
  initializer_list<bool> *local_880;
  initializer_list<bool> *__range2_1;
  AssertHelper local_858;
  Message local_850;
  int local_844;
  undefined1 local_840 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_810;
  Message local_808;
  int local_7fc;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar__19;
  size_t half;
  AssertHelper local_7c0;
  Message local_7b8;
  int local_7ac;
  undefined1 local_7a8 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_778;
  Message local_770;
  int local_764;
  undefined1 local_760 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_730;
  Message local_728;
  int local_71c;
  undefined1 local_718 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_6e8;
  Message local_6e0;
  int local_6d4;
  undefined1 local_6d0 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_6a0;
  Message local_698;
  undefined1 local_690 [8];
  AssertionResult gtest_ar__14;
  Message local_678;
  Bytes local_670;
  Bytes local_660;
  undefined1 local_650 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_620;
  Message local_618;
  int local_60c;
  undefined1 local_608 [8];
  AssertionResult gtest_ar__13;
  Message local_5f0;
  Bytes local_5e8;
  Bytes local_5d8;
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_598;
  Message local_590;
  int local_584;
  undefined1 local_580 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_550;
  Message local_548;
  bool local_539;
  undefined1 local_538 [8];
  AssertionResult gtest_ar__11;
  Message local_520;
  undefined1 local_518 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_4e8;
  Message local_4e0;
  int local_4d4;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_4a0;
  Message local_498;
  undefined1 local_490 [8];
  AssertionResult gtest_ar__9;
  EVP_PKEY_CTX *use_ctx;
  UniquePtr<EVP_PKEY_CTX> copy;
  ScopedTrace gtest_trace_289;
  bool copy_ctx;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<bool> local_450;
  initializer_list<bool> *local_440;
  initializer_list<bool> *__range2;
  AssertHelper local_418;
  Message local_410;
  int local_404;
  undefined1 local_400 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_3d0;
  Message local_3c8;
  int local_3bc;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_388;
  Message local_380;
  int local_374;
  undefined1 local_370 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_340;
  Message local_338;
  int local_32c;
  undefined1 local_328 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_2f8;
  Message local_2f0;
  int local_2e4;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_2b0;
  Message local_2a8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<EVP_PKEY_CTX> ctx;
  Message local_280;
  Bytes local_278;
  Bytes local_268;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_228;
  Message local_220;
  int local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar__2;
  Message local_1f8;
  Bytes local_1f0;
  Bytes local_1e0;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1a0;
  Message local_198;
  int local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar__1;
  uint8_t buf [82];
  Message local_118;
  Bytes local_110;
  Bytes local_100;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  string local_d8;
  AssertHelper local_b8;
  Message local_b0 [3];
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  size_t prk_len;
  uint8_t prk [64];
  HKDFTestVector *test;
  ulong uStack_20;
  ScopedTrace gtest_trace_257;
  size_t i;
  HKDFTest_TestVectors_Test *this_local;
  
  uStack_20 = 0;
  do {
    if (6 < uStack_20) {
      return;
    }
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              ((ScopedTrace *)((long)&test + 7),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
               ,0x101,&stack0xffffffffffffffe0);
    lVar9 = uStack_20 * 0x1b8;
    ppuVar4 = &(anonymous_namespace)::kTests + uStack_20 * 0x37;
    pEVar5 = (EVP_MD *)(*(code *)*ppuVar4)();
    puVar10 = &UNK_00aa5270 + lVar9;
    local_94 = HKDF_extract((uint8_t *)&prk_len,(size_t *)&gtest_ar_.message_,pEVar5,
                            &UNK_00aa5218 + lVar9,*(size_t *)(&DAT_00aa5268 + lVar9),puVar10,
                            *(size_t *)(&DAT_00aa52c0 + lVar9));
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_90,&local_94,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar2) {
      testing::Message::Message(local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_d8,(internal *)local_90,
                 (AssertionResult *)
                 "HKDF_extract(prk, &prk_len, test->md_func(), test->ikm, test->ikm_len, test->salt, test->salt_len)"
                 ,"false","true",(char *)puVar10);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x107,pcVar6);
      testing::internal::AssertHelper::operator=(&local_b8,local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      testing::Message::~Message(local_b0);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      Bytes::Bytes(&local_100,&UNK_00aa5320 + lVar9,*(size_t *)(&DAT_00aa5360 + lVar9));
      Bytes::Bytes(&local_110,(uint8_t *)&prk_len,
                   (size_t)gtest_ar_.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                ((EqHelper *)local_f0,"Bytes(test->prk, test->prk_len)","Bytes(prk, prk_len)",
                 &local_100,&local_110);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
      if (!bVar2) {
        testing::Message::Message(&local_118);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)(buf + 0x50),kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x108,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)(buf + 0x50),&local_118);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(buf + 0x50));
        testing::Message::~Message(&local_118);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
      sVar1 = *(size_t *)(&DAT_00aa5368 + lVar9);
      pEVar5 = (EVP_MD *)(*(code *)*ppuVar4)();
      puVar10 = &UNK_00aa52c8 + lVar9;
      local_18c = HKDF_expand((uint8_t *)&gtest_ar__1.message_,sVar1,pEVar5,(uint8_t *)&prk_len,
                              (size_t)gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl,puVar10,*(size_t *)(&DAT_00aa5318 + lVar9));
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_188,&local_18c,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
      if (!bVar2) {
        testing::Message::Message(&local_198);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_1.message_,(internal *)local_188,
                   (AssertionResult *)
                   "HKDF_expand(buf, test->out_len, test->md_func(), prk, prk_len, test->info, test->info_len)"
                   ,"false","true",(char *)puVar10);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x10c,pcVar6);
        testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
        testing::internal::AssertHelper::~AssertHelper(&local_1a0);
        std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_198);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        Bytes::Bytes(&local_1e0,&UNK_00aa5370 + lVar9,*(size_t *)(&DAT_00aa5368 + lVar9));
        Bytes::Bytes(&local_1f0,(uint8_t *)&gtest_ar__1.message_,*(size_t *)(&DAT_00aa5368 + lVar9))
        ;
        testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                  ((EqHelper *)local_1d0,"Bytes(test->out, test->out_len)",
                   "Bytes(buf, test->out_len)",&local_1e0,&local_1f0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
        if (!bVar2) {
          testing::Message::Message(&local_1f8);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x10d,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__2.message_,&local_1f8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
          testing::Message::~Message(&local_1f8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
        sVar1 = *(size_t *)(&DAT_00aa5368 + lVar9);
        pEVar5 = (EVP_MD *)(*(code *)*ppuVar4)();
        puVar10 = &UNK_00aa5270 + lVar9;
        local_214 = HKDF((uint8_t *)&gtest_ar__1.message_,sVar1,pEVar5,&UNK_00aa5218 + lVar9,
                         *(size_t *)(&DAT_00aa5268 + lVar9),puVar10,
                         *(size_t *)(&DAT_00aa52c0 + lVar9),&UNK_00aa52c8 + lVar9,
                         *(size_t *)(&DAT_00aa5318 + lVar9));
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_210,&local_214,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
        if (!bVar2) {
          testing::Message::Message(&local_220);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_2.message_,(internal *)local_210,
                     (AssertionResult *)
                     "HKDF(buf, test->out_len, test->md_func(), test->ikm, test->ikm_len, test->salt, test->salt_len, test->info, test->info_len)"
                     ,"false","true",(char *)puVar10);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_228,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x111,pcVar6);
          testing::internal::AssertHelper::operator=(&local_228,&local_220);
          testing::internal::AssertHelper::~AssertHelper(&local_228);
          std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_220);
        }
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
        if (gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          Bytes::Bytes(&local_268,&UNK_00aa5370 + lVar9,*(size_t *)(&DAT_00aa5368 + lVar9));
          Bytes::Bytes(&local_278,(uint8_t *)&gtest_ar__1.message_,
                       *(size_t *)(&DAT_00aa5368 + lVar9));
          testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                    ((EqHelper *)local_258,"Bytes(test->out, test->out_len)",
                     "Bytes(buf, test->out_len)",&local_268,&local_278);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
          if (!bVar2) {
            testing::Message::Message(&local_280);
            pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&ctx,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                       ,0x112,pcVar6);
            testing::internal::AssertHelper::operator=((AssertHelper *)&ctx,&local_280);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ctx);
            testing::Message::~Message(&local_280);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
          peVar7 = (pointer)EVP_PKEY_CTX_new_id(0x3c3,(ENGINE *)0x0);
          std::unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter> *)&gtest_ar__3.message_,
                     peVar7);
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_2a0,
                     (unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                     (type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
          if (!bVar2) {
            testing::Message::Message(&local_2a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__4.message_,(internal *)local_2a0,
                       (AssertionResult *)0x82c8ac,"false","true",(char *)puVar10);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_2b0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                       ,0x117,pcVar6);
            testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
            testing::internal::AssertHelper::~AssertHelper(&local_2b0);
            std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
            testing::Message::~Message(&local_2a8);
          }
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
          if (gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)
                                &gtest_ar__3.message_);
            local_2e4 = EVP_PKEY_derive_init((EVP_PKEY_CTX *)peVar7);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_2e0,&local_2e4,(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
            if (!bVar2) {
              testing::Message::Message(&local_2f0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__5.message_,(internal *)local_2e0,
                         (AssertionResult *)"EVP_PKEY_derive_init(ctx.get())","false","true",
                         (char *)puVar10);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_2f8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                         ,0x118,pcVar6);
              testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
              testing::internal::AssertHelper::~AssertHelper(&local_2f8);
              std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
              testing::Message::~Message(&local_2f0);
            }
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
            if (gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__3.message_);
              local_32c = EVP_PKEY_CTX_hkdf_mode(peVar7,1);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_328,&local_32c,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
              if (!bVar2) {
                testing::Message::Message(&local_338);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__6.message_,(internal *)local_328,
                           (AssertionResult *)"EVP_PKEY_CTX_hkdf_mode(ctx.get(), 1)","false","true",
                           (char *)puVar10);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_340,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                           ,0x11a,pcVar6);
                testing::internal::AssertHelper::operator=(&local_340,&local_338);
                testing::internal::AssertHelper::~AssertHelper(&local_340);
                std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
                testing::Message::~Message(&local_338);
              }
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
              if (gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__3.message_);
                pEVar5 = (EVP_MD *)(*(code *)*ppuVar4)();
                local_374 = EVP_PKEY_CTX_set_hkdf_md(peVar7,pEVar5);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_370,&local_374,(type *)0x0);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_370);
                if (!bVar2) {
                  testing::Message::Message(&local_380);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__7.message_,(internal *)local_370,
                             (AssertionResult *)
                             "EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func())","false","true",
                             (char *)puVar10);
                  pcVar6 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_388,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                             ,0x11b,pcVar6);
                  testing::internal::AssertHelper::operator=(&local_388,&local_380);
                  testing::internal::AssertHelper::~AssertHelper(&local_388);
                  std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                  testing::Message::~Message(&local_380);
                }
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar2;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
                if (gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__3.message_);
                  local_3bc = EVP_PKEY_CTX_set1_hkdf_key
                                        (peVar7,&UNK_00aa5218 + lVar9,
                                         *(size_t *)(&DAT_00aa5268 + lVar9));
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_3b8,&local_3bc,(type *)0x0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_3b8);
                  if (!bVar2) {
                    testing::Message::Message(&local_3c8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__8.message_,(internal *)local_3b8,
                               (AssertionResult *)
                               "EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->ikm, test->ikm_len)",
                               "false","true",(char *)puVar10);
                    pcVar6 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_3d0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                               ,0x11d,pcVar6);
                    testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
                    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
                    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                    testing::Message::~Message(&local_3c8);
                  }
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar2;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
                  if (gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)
                                        &gtest_ar__3.message_);
                    local_404 = EVP_PKEY_CTX_set1_hkdf_salt
                                          (peVar7,&UNK_00aa5270 + lVar9,
                                           *(size_t *)(&DAT_00aa52c0 + lVar9));
                    testing::AssertionResult::AssertionResult<int>
                              ((AssertionResult *)local_400,&local_404,(type *)0x0);
                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_400);
                    if (!bVar2) {
                      testing::Message::Message(&local_410);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&__range2,(internal *)local_400,
                                 (AssertionResult *)
                                 "EVP_PKEY_CTX_set1_hkdf_salt(ctx.get(), test->salt, test->salt_len)"
                                 ,"false","true",(char *)puVar10);
                      pcVar6 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_418,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                 ,0x11f,pcVar6);
                      testing::internal::AssertHelper::operator=(&local_418,&local_410);
                      testing::internal::AssertHelper::~AssertHelper(&local_418);
                      std::__cxx11::string::~string((string *)&__range2);
                      testing::Message::~Message(&local_410);
                    }
                    gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar2;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
                    if (gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      __begin2._6_1_ = 0;
                      __begin2._7_1_ = 1;
                      local_450._M_array = (iterator)((long)&__begin2 + 6);
                      local_450._M_len = 2;
                      local_440 = &local_450;
                      __end2 = std::initializer_list<bool>::begin(local_440);
                      pbVar8 = std::initializer_list<bool>::end(local_440);
                      for (; __end2 != pbVar8; __end2 = __end2 + 1) {
                        copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl._7_1_ =
                             *__end2 & 1;
                        testing::ScopedTrace::ScopedTrace<bool>
                                  ((ScopedTrace *)
                                   ((long)&copy._M_t.
                                           super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>.
                                           _M_head_impl + 6),
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                   ,0x121,(bool *)((long)&copy._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>.
                                                  _M_head_impl + 7));
                        std::unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter>::
                        unique_ptr<bssl::internal::Deleter,void>
                                  ((unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter> *)&use_ctx);
                        gtest_ar__9.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl =
                             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                              )std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__3.message_);
                        if ((copy._M_t.
                             super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl._7_1_ & 1)
                            == 0) {
LAB_0044f7ff:
                          gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )0x0;
                          local_4d4 = EVP_PKEY_derive((EVP_PKEY_CTX *)
                                                      gtest_ar__9.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(uchar *)0x0,
                                                  (size_t *)&gtest_ar_.message_);
                          testing::AssertionResult::AssertionResult<int>
                                    ((AssertionResult *)local_4d0,&local_4d4,(type *)0x0);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_4d0);
                          if (!bVar2) {
                            testing::Message::Message(&local_4e0);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar_3.message_,(internal *)local_4d0,
                                       (AssertionResult *)
                                       "EVP_PKEY_derive(use_ctx, nullptr, &prk_len)","false","true",
                                       (char *)puVar10);
                            pcVar6 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_4e8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                       ,300,pcVar6);
                            testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
                            testing::internal::AssertHelper::~AssertHelper(&local_4e8);
                            std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
                            testing::Message::~Message(&local_4e0);
                          }
                          gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar2;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
                          if (gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            testing::internal::EqHelper::
                            Compare<unsigned_long,_unsigned_long,_nullptr>
                                      ((EqHelper *)local_518,"prk_len","test->prk_len",
                                       (unsigned_long *)&gtest_ar_.message_,
                                       (unsigned_long *)(&DAT_00aa5360 + lVar9));
                            bVar2 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_518);
                            if (!bVar2) {
                              testing::Message::Message(&local_520);
                              pcVar6 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_518);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar__11.message_,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                         ,0x12d,pcVar6);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar__11.message_,&local_520);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar__11.message_);
                              testing::Message::~Message(&local_520);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_518)
                            ;
                            gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl =
                                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                  )(*(long *)(&DAT_00aa5360 + lVar9) + -1);
                            iVar3 = EVP_PKEY_derive((EVP_PKEY_CTX *)
                                                    gtest_ar__9.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(uchar *)&prk_len,
                                                  (size_t *)&gtest_ar_.message_);
                            local_539 = iVar3 == 0;
                            testing::AssertionResult::AssertionResult<bool>
                                      ((AssertionResult *)local_538,&local_539,(type *)0x0);
                            bVar2 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_538);
                            if (!bVar2) {
                              testing::Message::Message(&local_548);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__12.message_,(internal *)local_538,
                                         (AssertionResult *)
                                         "EVP_PKEY_derive(use_ctx, prk, &prk_len)","true","false",
                                         (char *)puVar10);
                              pcVar6 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_550,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                         ,0x131,pcVar6);
                              testing::internal::AssertHelper::operator=(&local_550,&local_548);
                              testing::internal::AssertHelper::~AssertHelper(&local_550);
                              std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                              testing::Message::~Message(&local_548);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_538)
                            ;
                            ERR_clear_error();
                            ::OPENSSL_memset(&prk_len,0,0x40);
                            gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl =
                                 *(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                   *)&((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)(&DAT_00aa5360 + lVar9))->_M_t;
                            local_584 = EVP_PKEY_derive((EVP_PKEY_CTX *)
                                                        gtest_ar__9.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(uchar *)&prk_len,
                                                  (size_t *)&gtest_ar_.message_);
                            testing::AssertionResult::AssertionResult<int>
                                      ((AssertionResult *)local_580,&local_584,(type *)0x0);
                            bVar2 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_580);
                            if (!bVar2) {
                              testing::Message::Message(&local_590);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar_4.message_,(internal *)local_580,
                                         (AssertionResult *)
                                         "EVP_PKEY_derive(use_ctx, prk, &prk_len)","false","true",
                                         (char *)puVar10);
                              pcVar6 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_598,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                         ,0x137,pcVar6);
                              testing::internal::AssertHelper::operator=(&local_598,&local_590);
                              testing::internal::AssertHelper::~AssertHelper(&local_598);
                              std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
                              testing::Message::~Message(&local_590);
                            }
                            gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar2;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_580)
                            ;
                            if (gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              Bytes::Bytes(&local_5d8,&UNK_00aa5320 + lVar9,
                                           *(size_t *)(&DAT_00aa5360 + lVar9));
                              Bytes::Bytes(&local_5e8,(uint8_t *)&prk_len,
                                           (size_t)gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                              testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                        ((EqHelper *)local_5c8,"Bytes(test->prk, test->prk_len)",
                                         "Bytes(prk, prk_len)",&local_5d8,&local_5e8);
                              bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_5c8);
                              if (!bVar2) {
                                testing::Message::Message(&local_5f0);
                                pcVar6 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_5c8);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar__13.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                           ,0x138,pcVar6);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar__13.message_,&local_5f0);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar__13.message_);
                                testing::Message::~Message(&local_5f0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_5c8);
                              ::OPENSSL_memset(&prk_len,0,0x40);
                              gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl =
                                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                    )(*(long *)(&DAT_00aa5360 + lVar9) + 1);
                              local_60c = EVP_PKEY_derive((EVP_PKEY_CTX *)
                                                          gtest_ar__9.message_._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(uchar *)&prk_len,
                                                  (size_t *)&gtest_ar_.message_);
                              testing::AssertionResult::AssertionResult<int>
                                        ((AssertionResult *)local_608,&local_60c,(type *)0x0);
                              bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_608);
                              if (!bVar2) {
                                testing::Message::Message(&local_618);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar_5.message_,(internal *)local_608,
                                           (AssertionResult *)
                                           "EVP_PKEY_derive(use_ctx, prk, &prk_len)","false","true",
                                           (char *)puVar10);
                                pcVar6 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_620,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                           ,0x13d,pcVar6);
                                testing::internal::AssertHelper::operator=(&local_620,&local_618);
                                testing::internal::AssertHelper::~AssertHelper(&local_620);
                                std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
                                testing::Message::~Message(&local_618);
                              }
                              gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._5_3_ = 0;
                              gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_1_ = !bVar2;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_608);
                              if (gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_ == 0) {
                                Bytes::Bytes(&local_660,&UNK_00aa5320 + lVar9,
                                             *(size_t *)(&DAT_00aa5360 + lVar9));
                                Bytes::Bytes(&local_670,(uint8_t *)&prk_len,
                                             (size_t)gtest_ar_.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                          ((EqHelper *)local_650,"Bytes(test->prk, test->prk_len)",
                                           "Bytes(prk, prk_len)",&local_660,&local_670);
                                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_650);
                                if (!bVar2) {
                                  testing::Message::Message(&local_678);
                                  pcVar6 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_650);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar__14.message_,kNonFatalFailure
                                             ,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                             ,0x13e,pcVar6);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar__14.message_,&local_678);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar__14.message_);
                                  testing::Message::~Message(&local_678);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_650);
                                gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ = 0;
                              }
                            }
                          }
                        }
                        else {
                          peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                               *)&gtest_ar__3.message_);
                          peVar7 = (pointer)EVP_PKEY_CTX_dup((EVP_PKEY_CTX *)peVar7);
                          std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::reset
                                    ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)
                                     &use_ctx,peVar7);
                          testing::AssertionResult::
                          AssertionResult<std::unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter>>
                                    ((AssertionResult *)local_490,
                                     (unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)
                                     &use_ctx,(type *)0x0);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_490);
                          if (!bVar2) {
                            testing::Message::Message(&local_498);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__10.message_,(internal *)local_490,
                                       (AssertionResult *)0x84ac21,"false","true",(char *)puVar10);
                            pcVar6 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_4a0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                       ,0x126,pcVar6);
                            testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
                            testing::internal::AssertHelper::~AssertHelper(&local_4a0);
                            std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                            testing::Message::~Message(&local_498);
                          }
                          gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar2;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
                          if (gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            gtest_ar__9.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl =
                                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                  )std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                               *)&use_ctx);
                            goto LAB_0044f7ff;
                          }
                        }
                        std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                                  ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&use_ctx)
                        ;
                        testing::ScopedTrace::~ScopedTrace
                                  ((ScopedTrace *)
                                   ((long)&copy._M_t.
                                           super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>.
                                           _M_head_impl + 6));
                        if (gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ != 0) goto LAB_00452c67;
                      }
                      peVar7 = (pointer)EVP_PKEY_CTX_new_id(0x3c3,(ENGINE *)0x0);
                      std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::reset
                                ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__3.message_,peVar7);
                      testing::AssertionResult::
                      AssertionResult<std::unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter>>
                                ((AssertionResult *)local_690,
                                 (unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__3.message_,(type *)0x0);
                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_690);
                      if (!bVar2) {
                        testing::Message::Message(&local_698);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__15.message_,(internal *)local_690,
                                   (AssertionResult *)0x82c8ac,"false","true",(char *)puVar10);
                        pcVar6 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_6a0,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                   ,0x142,pcVar6);
                        testing::internal::AssertHelper::operator=(&local_6a0,&local_698);
                        testing::internal::AssertHelper::~AssertHelper(&local_6a0);
                        std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
                        testing::Message::~Message(&local_698);
                      }
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar2;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_690);
                      if (gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)
                                            &gtest_ar__3.message_);
                        local_6d4 = EVP_PKEY_derive_init((EVP_PKEY_CTX *)peVar7);
                        testing::AssertionResult::AssertionResult<int>
                                  ((AssertionResult *)local_6d0,&local_6d4,(type *)0x0);
                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_6d0);
                        if (!bVar2) {
                          testing::Message::Message(&local_6e0);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__16.message_,(internal *)local_6d0,
                                     (AssertionResult *)"EVP_PKEY_derive_init(ctx.get())","false",
                                     "true",(char *)puVar10);
                          pcVar6 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_6e8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                     ,0x143,pcVar6);
                          testing::internal::AssertHelper::operator=(&local_6e8,&local_6e0);
                          testing::internal::AssertHelper::~AssertHelper(&local_6e8);
                          std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
                          testing::Message::~Message(&local_6e0);
                        }
                        gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar2;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d0);
                        if (gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                               *)&gtest_ar__3.message_);
                          local_71c = EVP_PKEY_CTX_hkdf_mode(peVar7,2);
                          testing::AssertionResult::AssertionResult<int>
                                    ((AssertionResult *)local_718,&local_71c,(type *)0x0);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_718);
                          if (!bVar2) {
                            testing::Message::Message(&local_728);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__17.message_,(internal *)local_718,
                                       (AssertionResult *)"EVP_PKEY_CTX_hkdf_mode(ctx.get(), 2)",
                                       "false","true",(char *)puVar10);
                            pcVar6 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_730,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                       ,0x145,pcVar6);
                            testing::internal::AssertHelper::operator=(&local_730,&local_728);
                            testing::internal::AssertHelper::~AssertHelper(&local_730);
                            std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
                            testing::Message::~Message(&local_728);
                          }
                          gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar2;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
                          if (gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                 *)&gtest_ar__3.message_);
                            pEVar5 = (EVP_MD *)(*(code *)*ppuVar4)();
                            local_764 = EVP_PKEY_CTX_set_hkdf_md(peVar7,pEVar5);
                            testing::AssertionResult::AssertionResult<int>
                                      ((AssertionResult *)local_760,&local_764,(type *)0x0);
                            bVar2 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_760);
                            if (!bVar2) {
                              testing::Message::Message(&local_770);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__18.message_,(internal *)local_760,
                                         (AssertionResult *)
                                         "EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func())",
                                         "false","true",(char *)puVar10);
                              pcVar6 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_778,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                         ,0x146,pcVar6);
                              testing::internal::AssertHelper::operator=(&local_778,&local_770);
                              testing::internal::AssertHelper::~AssertHelper(&local_778);
                              std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
                              testing::Message::~Message(&local_770);
                            }
                            gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar2;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_760)
                            ;
                            if (gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::
                                       get((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)
                                           &gtest_ar__3.message_);
                              local_7ac = EVP_PKEY_CTX_set1_hkdf_key
                                                    (peVar7,&UNK_00aa5320 + lVar9,
                                                     *(size_t *)(&DAT_00aa5360 + lVar9));
                              testing::AssertionResult::AssertionResult<int>
                                        ((AssertionResult *)local_7a8,&local_7ac,(type *)0x0);
                              bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_7a8);
                              if (!bVar2) {
                                testing::Message::Message(&local_7b8);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&half,(internal *)local_7a8,
                                           (AssertionResult *)
                                           "EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->prk, test->prk_len)"
                                           ,"false","true",(char *)puVar10);
                                pcVar6 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_7c0,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                           ,0x148,pcVar6);
                                testing::internal::AssertHelper::operator=(&local_7c0,&local_7b8);
                                testing::internal::AssertHelper::~AssertHelper(&local_7c0);
                                std::__cxx11::string::~string((string *)&half);
                                testing::Message::~Message(&local_7b8);
                              }
                              gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._5_3_ = 0;
                              gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_1_ = !bVar2;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_7a8);
                              if (gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_ == 0) {
                                gtest_ar__19.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl =
                                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                      )(*(ulong *)(&DAT_00aa5318 + lVar9) >> 1);
                                peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::
                                         get((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *
                                             )&gtest_ar__3.message_);
                                local_7fc = EVP_PKEY_CTX_add1_hkdf_info
                                                      (peVar7,&UNK_00aa52c8 + lVar9,
                                                       (size_t)gtest_ar__19.message_._M_t.
                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                testing::AssertionResult::AssertionResult<int>
                                          ((AssertionResult *)local_7f8,&local_7fc,(type *)0x0);
                                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_7f8);
                                if (!bVar2) {
                                  testing::Message::Message(&local_808);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)&gtest_ar__20.message_,(internal *)local_7f8,
                                             (AssertionResult *)
                                             "EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info, half)"
                                             ,"false","true",(char *)puVar10);
                                  pcVar6 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_810,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                             ,0x14b,pcVar6);
                                  testing::internal::AssertHelper::operator=(&local_810,&local_808);
                                  testing::internal::AssertHelper::~AssertHelper(&local_810);
                                  std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
                                  testing::Message::~Message(&local_808);
                                }
                                gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._5_3_ = 0;
                                gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_1_ = !bVar2;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_7f8);
                                if (gtest_ar.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_ == 0) {
                                  peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                           ::get((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__3.message_);
                                  local_844 = EVP_PKEY_CTX_add1_hkdf_info
                                                        (peVar7,&UNK_00aa52c8 +
                                                                (long)gtest_ar__19.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + lVar9,
                                                  *(long *)(&DAT_00aa5318 + lVar9) -
                                                  (long)gtest_ar__19.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                  testing::AssertionResult::AssertionResult<int>
                                            ((AssertionResult *)local_840,&local_844,(type *)0x0);
                                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_840);
                                  if (!bVar2) {
                                    testing::Message::Message(&local_850);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              ((string *)&__range2_1,(internal *)local_840,
                                               (AssertionResult *)
                                               "EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info + half, test->info_len - half)"
                                               ,"false","true",(char *)puVar10);
                                    pcVar6 = (char *)std::__cxx11::string::c_str();
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_858,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                               ,0x14d,pcVar6);
                                    testing::internal::AssertHelper::operator=
                                              (&local_858,&local_850);
                                    testing::internal::AssertHelper::~AssertHelper(&local_858);
                                    std::__cxx11::string::~string((string *)&__range2_1);
                                    testing::Message::~Message(&local_850);
                                  }
                                  gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._5_3_ = 0;
                                  gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_1_ = !bVar2;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_840);
                                  if (gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_ == 0) {
                                    __begin2_1._6_1_ = 0;
                                    __begin2_1._7_1_ = 1;
                                    local_890._M_array = (iterator)((long)&__begin2_1 + 6);
                                    local_890._M_len = 2;
                                    local_880 = &local_890;
                                    __end2_1 = std::initializer_list<bool>::begin(local_880);
                                    pbVar8 = std::initializer_list<bool>::end(local_880);
                                    for (; __end2_1 != pbVar8; __end2_1 = __end2_1 + 1) {
                                      copy_1._M_t.
                                      super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl.
                                      _7_1_ = *__end2_1 & 1;
                                      testing::ScopedTrace::ScopedTrace<bool>
                                                ((ScopedTrace *)
                                                 ((long)&copy_1._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>.
                                                  _M_head_impl + 6),
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                                 ,0x14f,(bool *)((long)&copy_1._M_t.
                                                                                                                                                
                                                  super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>.
                                                  _M_head_impl + 7));
                                      std::unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter>::
                                      unique_ptr<bssl::internal::Deleter,void>
                                                ((unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter>
                                                  *)&use_ctx_1);
                                      gtest_ar__21.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl =
                                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                            )std::
                                             unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::
                                             get((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__3.message_);
                                      if ((copy_1._M_t.
                                           super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>.
                                           _M_head_impl._7_1_ & 1) == 0) {
LAB_00451376:
                                        ::OPENSSL_memset(&gtest_ar__1.message_,0,0x52);
                                        gtest_ar__22.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl =
                                             *(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                               *)&((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)(&DAT_00aa5368 + lVar9))->_M_t;
                                        local_91c = EVP_PKEY_derive((EVP_PKEY_CTX *)
                                                                    gtest_ar__21.message_._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(uchar *)&gtest_ar__1.message_,
                                                  (size_t *)&gtest_ar__22.message_);
                                        testing::AssertionResult::AssertionResult<int>
                                                  ((AssertionResult *)local_918,&local_91c,
                                                   (type *)0x0);
                                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_918);
                                        if (!bVar2) {
                                          testing::Message::Message(&local_928);
                                          testing::internal::
                                          GetBoolAssertionFailureMessage_abi_cxx11_
                                                    ((string *)&gtest_ar_6.message_,
                                                     (internal *)local_918,
                                                     (AssertionResult *)
                                                     "EVP_PKEY_derive(use_ctx, buf, &len)","false",
                                                     "true",(char *)puVar10);
                                          pcVar6 = (char *)std::__cxx11::string::c_str();
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_930,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                                  ,0x159,pcVar6);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_930,&local_928);
                                          testing::internal::AssertHelper::~AssertHelper(&local_930)
                                          ;
                                          std::__cxx11::string::~string
                                                    ((string *)&gtest_ar_6.message_);
                                          testing::Message::~Message(&local_928);
                                        }
                                        gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._5_3_ = 0;
                                        gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_1_ = !bVar2;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_918);
                                        if (gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._4_4_ == 0) {
                                          Bytes::Bytes(&local_970,&UNK_00aa5370 + lVar9,
                                                       *(size_t *)(&DAT_00aa5368 + lVar9));
                                          Bytes::Bytes(&local_980,(uint8_t *)&gtest_ar__1.message_,
                                                       (size_t)gtest_ar__22.message_._M_t.
                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                          testing::internal::EqHelper::
                                          Compare<Bytes,_Bytes,_nullptr>
                                                    ((EqHelper *)local_960,
                                                     "Bytes(test->out, test->out_len)",
                                                     "Bytes(buf, len)",&local_970,&local_980);
                                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_960);
                                          if (!bVar2) {
                                            testing::Message::Message(&local_988);
                                            pcVar6 = testing::AssertionResult::failure_message
                                                               ((AssertionResult *)local_960);
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&gtest_ar__23.message_,
                                                       kNonFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                                  ,0x15a,pcVar6);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&gtest_ar__23.message_,
                                                       &local_988);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      ((AssertHelper *)&gtest_ar__23.message_);
                                            testing::Message::~Message(&local_988);
                                          }
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_960);
                                          gtest_ar.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._4_4_ = 0;
                                        }
                                      }
                                      else {
                                        peVar7 = std::
                                                 unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                 ::get((
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__3.message_);
                                        peVar7 = (pointer)EVP_PKEY_CTX_dup((EVP_PKEY_CTX *)peVar7);
                                        std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::
                                        reset((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                               *)&use_ctx_1,peVar7);
                                        testing::AssertionResult::
                                        AssertionResult<std::unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter>>
                                                  ((AssertionResult *)local_8d0,
                                                   (
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&use_ctx_1,(type *)0x0);
                                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_8d0);
                                        if (!bVar2) {
                                          testing::Message::Message(&local_8d8);
                                          testing::internal::
                                          GetBoolAssertionFailureMessage_abi_cxx11_
                                                    ((string *)&len,(internal *)local_8d0,
                                                     (AssertionResult *)0x84ac21,"false","true",
                                                     (char *)puVar10);
                                          pcVar6 = (char *)std::__cxx11::string::c_str();
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_8e0,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                                  ,0x154,pcVar6);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_8e0,&local_8d8);
                                          testing::internal::AssertHelper::~AssertHelper(&local_8e0)
                                          ;
                                          std::__cxx11::string::~string((string *)&len);
                                          testing::Message::~Message(&local_8d8);
                                        }
                                        gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._5_3_ = 0;
                                        gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_1_ = !bVar2;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_8d0);
                                        if (gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._4_4_ == 0) {
                                          gtest_ar__21.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl =
                                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                )std::
                                                 unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                 ::get((
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&use_ctx_1);
                                          goto LAB_00451376;
                                        }
                                      }
                                      std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::
                                      ~unique_ptr((
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&use_ctx_1);
                                      testing::ScopedTrace::~ScopedTrace
                                                ((ScopedTrace *)
                                                 ((long)&copy_1._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>.
                                                  _M_head_impl + 6));
                                      if (gtest_ar.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._4_4_ != 0) goto LAB_00452c67;
                                    }
                                    peVar7 = (pointer)EVP_PKEY_CTX_new_id(0x3c3,(ENGINE *)0x0);
                                    std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::reset
                                              ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                *)&gtest_ar__3.message_,peVar7);
                                    testing::AssertionResult::
                                    AssertionResult<std::unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter>>
                                              ((AssertionResult *)local_9a0,
                                               (unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                *)&gtest_ar__3.message_,(type *)0x0);
                                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_9a0);
                                    if (!bVar2) {
                                      testing::Message::Message(&local_9a8);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                ((string *)&gtest_ar__24.message_,
                                                 (internal *)local_9a0,(AssertionResult *)0x82c8ac,
                                                 "false","true",(char *)puVar10);
                                      pcVar6 = (char *)std::__cxx11::string::c_str();
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_9b0,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                                 ,0x15e,pcVar6);
                                      testing::internal::AssertHelper::operator=
                                                (&local_9b0,&local_9a8);
                                      testing::internal::AssertHelper::~AssertHelper(&local_9b0);
                                      std::__cxx11::string::~string
                                                ((string *)&gtest_ar__24.message_);
                                      testing::Message::~Message(&local_9a8);
                                    }
                                    gtest_ar.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._5_3_ = 0;
                                    gtest_ar.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_1_ = !bVar2;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_9a0);
                                    if (gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_4_ == 0) {
                                      peVar7 = std::
                                               unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                               ::get((
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__3.message_);
                                      local_9e4 = EVP_PKEY_derive_init((EVP_PKEY_CTX *)peVar7);
                                      testing::AssertionResult::AssertionResult<int>
                                                ((AssertionResult *)local_9e0,&local_9e4,(type *)0x0
                                                );
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_9e0);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_9f0);
                                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                  ((string *)&gtest_ar__25.message_,
                                                   (internal *)local_9e0,
                                                   (AssertionResult *)
                                                   "EVP_PKEY_derive_init(ctx.get())","false","true",
                                                   (char *)puVar10);
                                        pcVar6 = (char *)std::__cxx11::string::c_str();
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_9f8,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                                  ,0x15f,pcVar6);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_9f8,&local_9f0);
                                        testing::internal::AssertHelper::~AssertHelper(&local_9f8);
                                        std::__cxx11::string::~string
                                                  ((string *)&gtest_ar__25.message_);
                                        testing::Message::~Message(&local_9f0);
                                      }
                                      gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._5_3_ = 0;
                                      gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_1_ = !bVar2;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_9e0);
                                      if (gtest_ar.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._4_4_ == 0) {
                                        peVar7 = std::
                                                 unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                 ::get((
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__3.message_);
                                        local_a2c = EVP_PKEY_CTX_hkdf_mode(peVar7,0);
                                        testing::AssertionResult::AssertionResult<int>
                                                  ((AssertionResult *)local_a28,&local_a2c,
                                                   (type *)0x0);
                                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_a28);
                                        if (!bVar2) {
                                          testing::Message::Message(&local_a38);
                                          testing::internal::
                                          GetBoolAssertionFailureMessage_abi_cxx11_
                                                    ((string *)&gtest_ar__26.message_,
                                                     (internal *)local_a28,
                                                     (AssertionResult *)
                                                     "EVP_PKEY_CTX_hkdf_mode(ctx.get(), 0)","false",
                                                     "true",(char *)puVar10);
                                          pcVar6 = (char *)std::__cxx11::string::c_str();
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_a40,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                                  ,0x161,pcVar6);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_a40,&local_a38);
                                          testing::internal::AssertHelper::~AssertHelper(&local_a40)
                                          ;
                                          std::__cxx11::string::~string
                                                    ((string *)&gtest_ar__26.message_);
                                          testing::Message::~Message(&local_a38);
                                        }
                                        gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._5_3_ = 0;
                                        gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_1_ = !bVar2;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_a28);
                                        if (gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._4_4_ == 0) {
                                          peVar7 = std::
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ::get((
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__3.message_);
                                          pEVar5 = (EVP_MD *)(*(code *)*ppuVar4)();
                                          local_a74 = EVP_PKEY_CTX_set_hkdf_md(peVar7,pEVar5);
                                          testing::AssertionResult::AssertionResult<int>
                                                    ((AssertionResult *)local_a70,&local_a74,
                                                     (type *)0x0);
                                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_a70);
                                          if (!bVar2) {
                                            testing::Message::Message(&local_a80);
                                            testing::internal::
                                            GetBoolAssertionFailureMessage_abi_cxx11_
                                                      ((string *)&gtest_ar__27.message_,
                                                       (internal *)local_a70,
                                                       (AssertionResult *)
                                                                                                              
                                                  "EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func())"
                                                  ,"false","true",(char *)puVar10);
                                            pcVar6 = (char *)std::__cxx11::string::c_str();
                                            testing::internal::AssertHelper::AssertHelper
                                                      (&local_a88,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                                  ,0x162,pcVar6);
                                            testing::internal::AssertHelper::operator=
                                                      (&local_a88,&local_a80);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      (&local_a88);
                                            std::__cxx11::string::~string
                                                      ((string *)&gtest_ar__27.message_);
                                            testing::Message::~Message(&local_a80);
                                          }
                                          gtest_ar.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._5_3_ = 0;
                                          gtest_ar.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._4_1_ = !bVar2;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_a70);
                                          if (gtest_ar.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl._4_4_ == 0) {
                                            peVar7 = std::
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ::get((
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__3.message_);
                                            local_abc = EVP_PKEY_CTX_set1_hkdf_key
                                                                  (peVar7,&UNK_00aa5218 + lVar9,
                                                                   *(size_t *)
                                                                    (&DAT_00aa5268 + lVar9));
                                            testing::AssertionResult::AssertionResult<int>
                                                      ((AssertionResult *)local_ab8,&local_abc,
                                                       (type *)0x0);
                                            bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                              ((AssertionResult *)local_ab8);
                                            if (!bVar2) {
                                              testing::Message::Message(&local_ac8);
                                              testing::internal::
                                              GetBoolAssertionFailureMessage_abi_cxx11_
                                                        ((string *)&gtest_ar__28.message_,
                                                         (internal *)local_ab8,
                                                         (AssertionResult *)
                                                                                                                  
                                                  "EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->ikm, test->ikm_len)"
                                                  ,"false","true",(char *)puVar10);
                                              pcVar6 = (char *)std::__cxx11::string::c_str();
                                              testing::internal::AssertHelper::AssertHelper
                                                        (&local_ad0,kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                                  ,0x164,pcVar6);
                                              testing::internal::AssertHelper::operator=
                                                        (&local_ad0,&local_ac8);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        (&local_ad0);
                                              std::__cxx11::string::~string
                                                        ((string *)&gtest_ar__28.message_);
                                              testing::Message::~Message(&local_ac8);
                                            }
                                            gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._5_3_ = 0;
                                            gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._4_1_ = !bVar2;
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)local_ab8);
                                            if (gtest_ar.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._4_4_ == 0) {
                                              peVar7 = std::
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ::get((
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__3.message_);
                                              local_b04 = EVP_PKEY_CTX_set1_hkdf_salt
                                                                    (peVar7,&UNK_00aa5270 + lVar9,
                                                                     *(size_t *)
                                                                      (&DAT_00aa52c0 + lVar9));
                                              testing::AssertionResult::AssertionResult<int>
                                                        ((AssertionResult *)local_b00,&local_b04,
                                                         (type *)0x0);
                                              bVar2 = testing::AssertionResult::
                                                      operator_cast_to_bool
                                                                ((AssertionResult *)local_b00);
                                              if (!bVar2) {
                                                testing::Message::Message(&local_b10);
                                                testing::internal::
                                                GetBoolAssertionFailureMessage_abi_cxx11_
                                                          ((string *)&gtest_ar__29.message_,
                                                           (internal *)local_b00,
                                                           (AssertionResult *)
                                                                                                                      
                                                  "EVP_PKEY_CTX_set1_hkdf_salt(ctx.get(), test->salt, test->salt_len)"
                                                  ,"false","true",(char *)puVar10);
                                                pcVar6 = (char *)std::__cxx11::string::c_str();
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&local_b18,kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                                  ,0x166,pcVar6);
                                                testing::internal::AssertHelper::operator=
                                                          (&local_b18,&local_b10);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (&local_b18);
                                                std::__cxx11::string::~string
                                                          ((string *)&gtest_ar__29.message_);
                                                testing::Message::~Message(&local_b10);
                                              }
                                              gtest_ar.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl._5_3_ = 0;
                                              gtest_ar.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl._4_1_ = !bVar2;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)local_b00);
                                              if (gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                peVar7 = std::
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ::get((
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__3.message_);
                                                local_b4c = EVP_PKEY_CTX_add1_hkdf_info
                                                                      (peVar7,&UNK_00aa52c8 + lVar9,
                                                                       (size_t)gtest_ar__19.message_
                                                                               ._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<int>
                                                          ((AssertionResult *)local_b48,&local_b4c,
                                                           (type *)0x0);
                                                bVar2 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_b48);
                                                if (!bVar2) {
                                                  testing::Message::Message(&local_b58);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__30.message_,
                                                             (internal *)local_b48,
                                                             (AssertionResult *)
                                                                                                                          
                                                  "EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info, half)"
                                                  ,"false","true",(char *)puVar10);
                                                  pcVar6 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_b60,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                                  ,0x168,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_b60,&local_b58);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_b60);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__30.message_);
                                                  testing::Message::~Message(&local_b58);
                                                }
                                                gtest_ar.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._5_3_ = 0;
                                                gtest_ar.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._4_1_ = !bVar2;
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_b48);
                                                if (gtest_ar.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                  peVar7 = std::
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ::get((
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__3.message_);
                                                  local_b94 = EVP_PKEY_CTX_add1_hkdf_info
                                                                        (peVar7,&UNK_00aa52c8 +
                                                                                (long)gtest_ar__19.
                                                                                      message_._M_t.
                                                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + lVar9,
                                                  *(long *)(&DAT_00aa5318 + lVar9) -
                                                  (long)gtest_ar__19.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::AssertionResult::AssertionResult<int>
                                                            ((AssertionResult *)local_b90,&local_b94
                                                             ,(type *)0x0);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_b90);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_ba0);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&__range2_2,
                                                               (internal *)local_b90,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info + half, test->info_len - half)"
                                                  ,"false","true",(char *)puVar10);
                                                  pcVar6 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_ba8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                                  ,0x16a,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_ba8,&local_ba0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_ba8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&__range2_2);
                                                  testing::Message::~Message(&local_ba0);
                                                  }
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_b90);
                                                  if (gtest_ar.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    __begin2_2._6_1_ = 0;
                                                    __begin2_2._7_1_ = 1;
                                                    local_be0._M_array =
                                                         (iterator)((long)&__begin2_2 + 6);
                                                    local_be0._M_len = 2;
                                                    local_bd0 = &local_be0;
                                                    __end2_2 = std::initializer_list<bool>::begin
                                                                         (local_bd0);
                                                    pbVar8 = std::initializer_list<bool>::end
                                                                       (local_bd0);
                                                    for (; __end2_2 != pbVar8;
                                                        __end2_2 = __end2_2 + 1) {
                                                      copy_2._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>.
                                                  _M_head_impl._7_1_ = *__end2_2 & 1;
                                                  testing::ScopedTrace::ScopedTrace<bool>
                                                            ((ScopedTrace *)
                                                             ((long)&copy_2._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>.
                                                  _M_head_impl + 6),
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                                  ,0x16c,(bool *)((long)&copy_2._M_t.
                                                                                                                                                  
                                                  super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>.
                                                  _M_head_impl + 7));
                                                  std::
                                                  unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter>
                                                  ::unique_ptr<bssl::internal::Deleter,void>
                                                            ((
                                                  unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter>
                                                  *)&use_ctx_2);
                                                  gtest_ar__31.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )std::
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ::get((
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__3.message_);
                                                  if ((copy_2._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>.
                                                  _M_head_impl._7_1_ & 1) == 0) {
LAB_00452898:
                                                    ::OPENSSL_memset(&gtest_ar__1.message_,0,0x52);
                                                    gtest_ar__32.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       *(
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  *)&((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)(&DAT_00aa5368 + lVar9))->_M_t;
                                                  local_c6c = EVP_PKEY_derive((EVP_PKEY_CTX *)
                                                                              gtest_ar__31.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(uchar *)&gtest_ar__1.message_,
                                                  (size_t *)&gtest_ar__32.message_);
                                                  testing::AssertionResult::AssertionResult<int>
                                                            ((AssertionResult *)local_c68,&local_c6c
                                                             ,(type *)0x0);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_c68);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_c78);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar_7.message_,
                                                               (internal *)local_c68,
                                                               (AssertionResult *)
                                                               "EVP_PKEY_derive(use_ctx, buf, &len)"
                                                               ,"false","true",(char *)puVar10);
                                                    pcVar6 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_c80,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                                  ,0x176,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_c80,&local_c78);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_c80);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_7.message_);
                                                  testing::Message::~Message(&local_c78);
                                                  }
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_c68);
                                                  if (gtest_ar.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    Bytes::Bytes(&local_cc0,&UNK_00aa5370 + lVar9,
                                                                 *(size_t *)(&DAT_00aa5368 + lVar9))
                                                    ;
                                                    Bytes::Bytes(&local_cd0,
                                                                 (uint8_t *)&gtest_ar__1.message_,
                                                                 (size_t)gtest_ar__32.message_._M_t.
                                                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  testing::internal::EqHelper::
                                                  Compare<Bytes,_Bytes,_nullptr>
                                                            ((EqHelper *)local_cb0,
                                                             "Bytes(test->out, test->out_len)",
                                                             "Bytes(buf, len)",&local_cc0,&local_cd0
                                                            );
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_cb0);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_cd8);
                                                    pcVar6 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_cb0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_ce0,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                                  ,0x177,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_ce0,&local_cd8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_ce0);
                                                  testing::Message::~Message(&local_cd8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_cb0);
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ = 0;
                                                  }
                                                  }
                                                  else {
                                                    peVar7 = std::
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ::get((
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__3.message_);
                                                  peVar7 = (pointer)EVP_PKEY_CTX_dup((EVP_PKEY_CTX *
                                                                                     )peVar7);
                                                  std::
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ::reset((
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&use_ctx_2,peVar7);
                                                  testing::AssertionResult::
                                                  AssertionResult<std::unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter>>
                                                            ((AssertionResult *)local_c20,
                                                             (
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&use_ctx_2,(type *)0x0);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_c20);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_c28);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&len_1,
                                                               (internal *)local_c20,
                                                               (AssertionResult *)0x84ac21,"false",
                                                               "true",(char *)puVar10);
                                                    pcVar6 = (char *)std::__cxx11::string::c_str();
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_c30,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                                  ,0x171,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_c30,&local_c28);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_c30);
                                                  std::__cxx11::string::~string((string *)&len_1);
                                                  testing::Message::~Message(&local_c28);
                                                  }
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_c20);
                                                  if (gtest_ar.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    gtest_ar__31.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )std::
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ::get((
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&use_ctx_2);
                                                  goto LAB_00452898;
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ::~unique_ptr((
                                                  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  *)&use_ctx_2);
                                                  testing::ScopedTrace::~ScopedTrace
                                                            ((ScopedTrace *)
                                                             ((long)&copy_2._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>.
                                                  _M_head_impl + 6));
                                                  if (gtest_ar.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ != 0) goto LAB_00452c67;
                                                  }
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ = 0;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
LAB_00452c67:
          std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
        }
      }
    }
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&test + 7));
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) {
      return;
    }
    uStack_20 = uStack_20 + 1;
  } while( true );
}

Assistant:

TEST(HKDFTest, TestVectors) {
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kTests); i++) {
    SCOPED_TRACE(i);
    const HKDFTestVector *test = &kTests[i];

    uint8_t prk[EVP_MAX_MD_SIZE];
    size_t prk_len;
    ASSERT_TRUE(HKDF_extract(prk, &prk_len, test->md_func(), test->ikm,
                             test->ikm_len, test->salt, test->salt_len));
    EXPECT_EQ(Bytes(test->prk, test->prk_len), Bytes(prk, prk_len));

    uint8_t buf[82];
    ASSERT_TRUE(HKDF_expand(buf, test->out_len, test->md_func(), prk, prk_len,
                            test->info, test->info_len));
    EXPECT_EQ(Bytes(test->out, test->out_len), Bytes(buf, test->out_len));

    ASSERT_TRUE(HKDF(buf, test->out_len, test->md_func(), test->ikm,
                     test->ikm_len, test->salt, test->salt_len, test->info,
                     test->info_len));
    EXPECT_EQ(Bytes(test->out, test->out_len), Bytes(buf, test->out_len));

    // Repeat the test with the OpenSSL compatibility |EVP_PKEY_derive| API.
    bssl::UniquePtr<EVP_PKEY_CTX> ctx(
        EVP_PKEY_CTX_new_id(EVP_PKEY_HKDF, nullptr));
    ASSERT_TRUE(ctx);
    ASSERT_TRUE(EVP_PKEY_derive_init(ctx.get()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_hkdf_mode(ctx.get(), EVP_PKEY_HKDEF_MODE_EXTRACT_ONLY));
    ASSERT_TRUE(EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->ikm, test->ikm_len));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_salt(ctx.get(), test->salt, test->salt_len));
    for (bool copy_ctx : {false, true}) {
      SCOPED_TRACE(copy_ctx);
      bssl::UniquePtr<EVP_PKEY_CTX> copy;
      EVP_PKEY_CTX *use_ctx = ctx.get();
      if (copy_ctx) {
        copy.reset(EVP_PKEY_CTX_dup(ctx.get()));
        ASSERT_TRUE(copy);
        use_ctx = copy.get();
      }

      // A null output should report the length.
      prk_len = 0;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, nullptr, &prk_len));
      EXPECT_EQ(prk_len, test->prk_len);

      // Too small of a buffer should cleanly fail.
      prk_len = test->prk_len - 1;
      EXPECT_FALSE(EVP_PKEY_derive(use_ctx, prk, &prk_len));
      ERR_clear_error();

      // Test the correct buffer size.
      OPENSSL_memset(prk, 0, sizeof(prk));
      prk_len = test->prk_len;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, prk, &prk_len));
      EXPECT_EQ(Bytes(test->prk, test->prk_len), Bytes(prk, prk_len));

      // Test a larger buffer than necessary.
      OPENSSL_memset(prk, 0, sizeof(prk));
      prk_len = test->prk_len + 1;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, prk, &prk_len));
      EXPECT_EQ(Bytes(test->prk, test->prk_len), Bytes(prk, prk_len));
    }

    ctx.reset(EVP_PKEY_CTX_new_id(EVP_PKEY_HKDF, nullptr));
    ASSERT_TRUE(ctx);
    ASSERT_TRUE(EVP_PKEY_derive_init(ctx.get()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_hkdf_mode(ctx.get(), EVP_PKEY_HKDEF_MODE_EXPAND_ONLY));
    ASSERT_TRUE(EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->prk, test->prk_len));
    // |info| can be passed in multiple parts.
    size_t half = test->info_len / 2;
    ASSERT_TRUE(EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info, half));
    ASSERT_TRUE(EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info + half,
                                            test->info_len - half));
    for (bool copy_ctx : {false, true}) {
      SCOPED_TRACE(copy_ctx);
      bssl::UniquePtr<EVP_PKEY_CTX> copy;
      EVP_PKEY_CTX *use_ctx = ctx.get();
      if (copy_ctx) {
        copy.reset(EVP_PKEY_CTX_dup(ctx.get()));
        ASSERT_TRUE(copy);
        use_ctx = copy.get();
      }
      OPENSSL_memset(buf, 0, sizeof(buf));
      size_t len = test->out_len;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, buf, &len));
      EXPECT_EQ(Bytes(test->out, test->out_len), Bytes(buf, len));
    }

    ctx.reset(EVP_PKEY_CTX_new_id(EVP_PKEY_HKDF, nullptr));
    ASSERT_TRUE(ctx);
    ASSERT_TRUE(EVP_PKEY_derive_init(ctx.get()));
    ASSERT_TRUE(EVP_PKEY_CTX_hkdf_mode(ctx.get(),
                                       EVP_PKEY_HKDEF_MODE_EXTRACT_AND_EXPAND));
    ASSERT_TRUE(EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->ikm, test->ikm_len));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_salt(ctx.get(), test->salt, test->salt_len));
    // |info| can be passed in multiple parts.
    ASSERT_TRUE(EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info, half));
    ASSERT_TRUE(EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info + half,
                                            test->info_len - half));
    for (bool copy_ctx : {false, true}) {
      SCOPED_TRACE(copy_ctx);
      bssl::UniquePtr<EVP_PKEY_CTX> copy;
      EVP_PKEY_CTX *use_ctx = ctx.get();
      if (copy_ctx) {
        copy.reset(EVP_PKEY_CTX_dup(ctx.get()));
        ASSERT_TRUE(copy);
        use_ctx = copy.get();
      }
      OPENSSL_memset(buf, 0, sizeof(buf));
      size_t len = test->out_len;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, buf, &len));
      EXPECT_EQ(Bytes(test->out, test->out_len), Bytes(buf, len));
    }
  }
}